

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JunitReporter::writeAssertions(JunitReporter *this,SectionNode *sectionNode)

{
  pointer pAVar1;
  AssertionStats *stats;
  AssertionOrBenchmarkResult *assertionOrBenchmark;
  pointer pAVar2;
  
  pAVar1 = (sectionNode->assertionsAndBenchmarks).
           super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pAVar2 = (sectionNode->assertionsAndBenchmarks).
                super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar2 != pAVar1; pAVar2 = pAVar2 + 1) {
    stats = (pAVar2->m_assertion).nullableValue;
    if (stats != (AssertionStats *)0x0) {
      writeAssertion(this,stats);
    }
  }
  return;
}

Assistant:

void JunitReporter::writeAssertions( SectionNode const& sectionNode ) {
        for (auto const& assertionOrBenchmark : sectionNode.assertionsAndBenchmarks) {
            if (assertionOrBenchmark.isAssertion()) {
                writeAssertion(assertionOrBenchmark.asAssertion());
            }
        }
    }